

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O2

void __thiscall Clasp::Cli::Output::stopStep(Output *this,Summary *s)

{
  FacadePtr pCVar1;
  bool bVar2;
  Model *pMVar3;
  Output *this_00;
  Model m;
  
  pMVar3 = ClaspFacade::Summary::model(s);
  if ((pMVar3 == (Model *)0x0) || (this->last_ != true)) {
    if (this->quiet_[0] == '\0') {
      pMVar3 = ClaspFacade::Summary::model(s);
      if (pMVar3 != (Model *)0x0) {
        pMVar3 = ClaspFacade::Summary::model(s);
        if ((pMVar3->field_0x23 & 0x20) != 0) {
          pMVar3 = ClaspFacade::Summary::model(s);
          if ((pMVar3->field_0x23 & 8) == 0) {
            pCVar1 = s->facade;
            pMVar3 = ClaspFacade::Summary::model(s);
            (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[8])
                      (this,&(pCVar1->ctx).output,pMVar3,0);
          }
        }
      }
    }
  }
  else {
    pMVar3 = ClaspFacade::Summary::model(s);
    m.num._0_4_ = (undefined4)pMVar3->num;
    m.num._4_4_ = *(undefined4 *)((long)&pMVar3->num + 4);
    m.ctx._0_4_ = *(undefined4 *)&pMVar3->ctx;
    m.ctx._4_4_ = *(undefined4 *)((long)&pMVar3->ctx + 4);
    m.values._0_4_ = *(undefined4 *)&pMVar3->values;
    m.values._4_4_ = *(undefined4 *)((long)&pMVar3->values + 4);
    m.costs._0_4_ = *(undefined4 *)&pMVar3->costs;
    m.costs._4_4_ = *(undefined4 *)((long)&pMVar3->costs + 4);
    m._32_8_ = *(ulong *)&pMVar3->field_0x20 & 0xffffffffdfffffff;
    (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[8])
              (this,&(s->facade->ctx).output,&m,1);
  }
  if (this->quiet_[2] == '\x01') {
    this->summary_ = s;
  }
  else if (this->quiet_[2] == '\0') {
    this_00 = this;
    (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[0xc])(this,s,0);
    bVar2 = stats(this_00,s);
    if (bVar2) {
      (*(this->super_EventHandler).super_ModelHandler._vptr_ModelHandler[0xd])(this,s,0);
    }
  }
  return;
}

Assistant:

void Output::stopStep(const ClaspFacade::Summary& s){
	if (s.model() && last_) {
		Model m = *s.model();
		m.up = 0; // ignore update state and always print as model
		printModel(s.ctx().output, m, print_best);
	}
	else if (modelQ() == print_all && s.model() && s.model()->up && !s.model()->def) {
		printModel(s.ctx().output, *s.model(), print_all);
	}
	if (callQ() == print_all) {
		printSummary(s, false);
		if (stats(s)) { printStatistics(s, false); }
	}
	else if (callQ() == print_best) {
		summary_ = &s;
	}
}